

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiViewportP::~ImGuiViewportP(ImGuiViewportP *this)

{
  int *piVar1;
  void *pvVar2;
  long lVar3;
  
  if (this->DrawLists[0] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[0]);
  }
  if (this->DrawLists[1] != (ImDrawList *)0x0) {
    IM_DELETE<ImDrawList>(this->DrawLists[1]);
  }
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)&(this->DrawDataBuilder).Layers[1].Data + lVar3);
    if (pvVar2 != (void *)0x0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pvVar2,GImAllocatorUserData);
    }
    lVar3 = lVar3 + -0x10;
  } while (lVar3 != -0x20);
  (this->DrawDataP).Valid = false;
  (this->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
  (this->DrawDataP).CmdLists = (ImDrawList **)0x0;
  (this->DrawDataP).CmdListsCount = 0;
  (this->DrawDataP).TotalIdxCount = 0;
  (this->DrawDataP).TotalVtxCount = 0;
  (this->DrawDataP).DisplayPos.x = 0.0;
  *(undefined8 *)&(this->DrawDataP).DisplayPos.y = 0;
  (this->DrawDataP).DisplaySize.x = 0.0;
  (this->DrawDataP).DisplaySize.y = 0.0;
  (this->DrawDataP).FramebufferScale.x = 0.0;
  (this->DrawDataP).FramebufferScale.y = 0.0;
  if ((this->super_ImGuiViewport).RendererUserData == (void *)0x0 &&
      (this->super_ImGuiViewport).PlatformUserData == (void *)0x0) {
    return;
  }
  __assert_fail("PlatformUserData == __null && RendererUserData == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.h"
                ,0xb14,"ImGuiViewport::~ImGuiViewport()");
}

Assistant:

~ImGuiViewportP()               { if (DrawLists[0]) IM_DELETE(DrawLists[0]); if (DrawLists[1]) IM_DELETE(DrawLists[1]); }